

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yymatchString(GREG *G,char *s)

{
  int iVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  
  cVar2 = *s;
  if (cVar2 != '\0') {
    iVar1 = G->pos;
    pcVar4 = s + 1;
    iVar3 = iVar1;
    do {
      if (G->limit <= iVar3) {
        iVar3 = yyrefill(G);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = G->pos;
        cVar2 = pcVar4[-1];
      }
      if (G->buf[iVar3] != cVar2) {
        G->pos = iVar1;
        return 0;
      }
      iVar3 = iVar3 + 1;
      G->pos = iVar3;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar2 != '\0');
  }
  return 1;
}

Assistant:

YY_LOCAL(int) yymatchString(GREG *G, const char *s)
{
  int yysav= G->pos;
  while (*s)
    {
      if (G->pos >= G->limit && !yyrefill(G)) return 0;
      if (G->buf[G->pos] != *s)
        {
          G->pos= yysav;
          return 0;
        }
      ++s;
      ++G->pos;
    }
  return 1;
}